

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O0

string * __thiscall antlr::NoViableAltException::getMessage_abi_cxx11_(NoViableAltException *this)

{
  int iVar1;
  Token *pTVar2;
  AST *pAVar3;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [39];
  allocator<char> local_49;
  string local_48 [35];
  allocator<char> local_25 [20];
  allocator<char> local_11 [17];
  
  this_00 = in_RDI;
  pTVar2 = TokenRefCount::operator_cast_to_Token_((TokenRefCount *)(in_RSI + 0x50));
  if (pTVar2 == (Token *)0x0) {
    pAVar3 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)(in_RSI + 0x58));
    if (pAVar3 == (AST *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_RDI,(allocator<char> *)in_stack_ffffffffffffff20);
      std::allocator<char>::~allocator(&local_71);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_RDI,(allocator<char> *)in_stack_ffffffffffffff20);
      pAVar3 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)(in_RSI + 0x58));
      (*pAVar3->_vptr_AST[0x18])(local_c0);
      std::operator+(in_RDI,in_stack_ffffffffffffff20);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  else {
    pTVar2 = TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)(in_RSI + 0x50))
    ;
    iVar1 = (*pTVar2->_vptr_Token[6])();
    if (iVar1 == 1) {
      __a = local_11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)in_RDI,__a);
      std::allocator<char>::~allocator(local_11);
    }
    else {
      pTVar2 = TokenRefCount<antlr::Token>::operator->
                         ((TokenRefCount<antlr::Token> *)(in_RSI + 0x50));
      iVar1 = (*pTVar2->_vptr_Token[6])();
      if (iVar1 == 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)in_RDI,(allocator<char> *)in_stack_ffffffffffffff20);
        std::allocator<char>::~allocator(local_25);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)in_RDI,(allocator<char> *)in_stack_ffffffffffffff20);
        pTVar2 = TokenRefCount<antlr::Token>::operator->
                           ((TokenRefCount<antlr::Token> *)(in_RSI + 0x50));
        (*pTVar2->_vptr_Token[4])(local_70);
        std::operator+(in_RDI,in_stack_ffffffffffffff20);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator(&local_49);
      }
    }
  }
  return this_00;
}

Assistant:

string NoViableAltException::getMessage() const
{
	if (token)
	{
		if( token->getType() == Token::EOF_TYPE )
			return string("unexpected end of file");
		else if( token->getType() == Token::NULL_TREE_LOOKAHEAD )
			return string("unexpected end of tree");
		else
			return string("unexpected token: ")+token->getText();
	}

	// must a tree parser error if token==null
	if (!node)
		return "unexpected end of subtree";

	return string("unexpected AST node: ")+node->toString();
}